

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

size_t pack_loc(char **buf,LocMsg *lmsg)

{
  size_t local_30;
  size_t len;
  char *ptr;
  LocMsg *lmsg_local;
  char **buf_local;
  
  ptr = (char *)lmsg;
  lmsg_local = (LocMsg *)buf;
  if (lmsg->file == (char *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = strlen(lmsg->file);
  }
  len = (size_t)emalloc(local_30 + 0xc);
  *(size_t *)lmsg_local = len;
  pack_type((char **)&len,CK_MSG_LOC);
  pack_str((char **)&len,*(char **)(ptr + 8));
  if (0xffffffff < (ulong)(long)*(int *)ptr) {
    eprintf("Value of lmsg->line (%d) too big, max allowed %u\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
            ,0x135,(ulong)*(uint *)ptr,0xffffffff);
  }
  pack_int((char **)&len,*(ck_uint32 *)ptr);
  return local_30 + 0xc;
}

Assistant:

static size_t pack_loc(char **buf, LocMsg * lmsg)
{
    char *ptr;
    size_t len;

    len = 4 + 4 + (lmsg->file ? strlen(lmsg->file) : 0) + 4;
    *buf = ptr = (char *)emalloc(len);

    pack_type(&ptr, CK_MSG_LOC);
    pack_str(&ptr, lmsg->file);
    if((size_t) lmsg->line > (size_t) CK_UINT32_MAX)
        eprintf("Value of lmsg->line (%d) too big, max allowed %u\n",
                __FILE__, __LINE__, lmsg->line, CK_UINT32_MAX);
    pack_int(&ptr, (ck_uint32) lmsg->line);

    return len;
}